

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O1

void Gia_WinCreateFromCut(Gia_Man_t *p,Vec_Int_t *vIn,Vec_Wec_t *vLevels,Vec_Int_t *vWin)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  Vec_Int_t *p_00;
  int *piVar10;
  Vec_Int_t *pVVar11;
  long lVar12;
  Gia_Obj_t *pGVar13;
  Vec_Int_t *pVVar14;
  long lVar15;
  int iVar16;
  size_t sVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar10 = (int *)malloc(400);
  p_00->pArray = piVar10;
  if (0 < (long)vLevels->nSize) {
    lVar15 = 0;
    iVar16 = 0;
    do {
      iVar16 = iVar16 + *(int *)((long)&vLevels->pArray->nSize + lVar15);
      lVar15 = lVar15 + 0x10;
    } while ((long)vLevels->nSize * 0x10 != lVar15);
    if (iVar16 != 0) {
      __assert_fail("Vec_WecSizeSize(vLevels) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                    ,0x3de,
                    "void Gia_WinCreateFromCut(Gia_Man_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)")
      ;
    }
  }
  vWin->nSize = 0;
  Gia_ManIncrementTravId(p);
  if (0 < vIn->nSize) {
    lVar15 = 0;
    do {
      iVar16 = vIn->pArray[lVar15];
      if (p->nTravIdsAlloc <= iVar16) {
        __assert_fail("Id < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x266,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
      }
      p->pTravIds[iVar16] = p->nTravIds;
      uVar7 = Gia_ObjLevelId(p,iVar16);
      if (vLevels->nSize <= (int)uVar7) {
        iVar9 = uVar7 + 1;
        iVar8 = vLevels->nSize * 2;
        if (iVar8 <= iVar9) {
          iVar8 = iVar9;
        }
        if (vLevels->nCap < iVar8) {
          sVar17 = (long)iVar8 << 4;
          if (vLevels->pArray == (Vec_Int_t *)0x0) {
            pVVar11 = (Vec_Int_t *)malloc(sVar17);
          }
          else {
            pVVar11 = (Vec_Int_t *)realloc(vLevels->pArray,sVar17);
          }
          vLevels->pArray = pVVar11;
          memset(pVVar11 + vLevels->nCap,0,((long)iVar8 - (long)vLevels->nCap) * 0x10);
          vLevels->nCap = iVar8;
        }
        vLevels->nSize = iVar9;
      }
      if (((int)uVar7 < 0) || (vLevels->nSize <= (int)uVar7)) goto LAB_007a6d8a;
      Vec_IntPush(vLevels->pArray + uVar7,iVar16);
      Vec_IntPush(vWin,iVar16);
      iVar16 = Gia_ObjLevelId(p,iVar16);
      Vec_IntPushUniqueOrder(p_00,iVar16);
      lVar15 = lVar15 + 1;
    } while (lVar15 < vIn->nSize);
  }
  if (0 < p_00->nSize) {
    lVar15 = 0;
    do {
      lVar12 = (long)p_00->pArray[lVar15];
      if ((lVar12 < 0) || (vLevels->nSize <= p_00->pArray[lVar15])) {
LAB_007a6d8a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar11 = vLevels->pArray;
      if (0 < pVVar11[lVar12].nSize) {
        lVar19 = 0;
LAB_007a6928:
        iVar16 = pVVar11[lVar12].pArray[lVar19];
        if (((long)iVar16 < 0) || (p->nObjs <= iVar16)) {
LAB_007a6d4c:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs != (Gia_Obj_t *)0x0) {
          pGVar1 = p->pObjs + iVar16;
          pGVar13 = p->pObjs;
          if (pGVar1 < pGVar13) {
LAB_007a6d2d:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar16 = 0;
          do {
            iVar9 = p->nObjs;
            pGVar2 = pGVar13 + iVar9;
            if (pGVar2 <= pGVar1) goto LAB_007a6d2d;
            uVar7 = (int)((long)pGVar1 - (long)pGVar13 >> 2) * -0x55555555;
            if (((int)uVar7 < 0) || (p->vFanoutNums->nSize <= (int)uVar7)) {
LAB_007a6d0e:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (p->vFanoutNums->pArray[uVar7 & 0x7fffffff] <= iVar16) goto LAB_007a6c8e;
            iVar8 = p->vFanout->nSize;
            if (iVar8 <= (int)uVar7) goto LAB_007a6d0e;
            piVar10 = p->vFanout->pArray;
            uVar7 = piVar10[uVar7 & 0x7fffffff] + iVar16;
            if (((int)uVar7 < 0) || (iVar8 <= (int)uVar7)) goto LAB_007a6d0e;
            iVar8 = piVar10[uVar7];
            lVar18 = (long)iVar8;
            if ((lVar18 < 0) || (iVar9 <= iVar8)) goto LAB_007a6d4c;
            iVar16 = iVar16 + 1;
            if (iVar16 == 6) goto LAB_007a6c8e;
            pGVar3 = pGVar13 + lVar18;
            uVar6 = *(ulong *)pGVar3;
            if ((uVar6 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar6) {
              if (iVar9 <= iVar8) goto LAB_007a6d2d;
              iVar9 = p->nTravIdsAlloc;
              if (iVar9 <= iVar8) {
LAB_007a6d6b:
                __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                              ,0x264,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
              }
              piVar10 = p->pTravIds;
              iVar5 = p->nTravIds;
              if (piVar10[lVar18] != iVar5) {
                pGVar4 = pGVar3 + -(uVar6 & 0x1fffffff);
                if ((pGVar4 < pGVar13) || (pGVar2 <= pGVar4)) goto LAB_007a6d2d;
                iVar20 = (int)((long)pGVar4 - (long)pGVar13 >> 2) * -0x55555555;
                if (iVar9 <= iVar20) goto LAB_007a6d6b;
                if (piVar10[iVar20] == iVar5) {
                  pGVar4 = pGVar3 + -(ulong)((uint)(uVar6 >> 0x20) & 0x1fffffff);
                  if ((pGVar4 < pGVar13) || (pGVar2 <= pGVar4)) goto LAB_007a6d2d;
                  iVar20 = (int)((long)pGVar4 - (long)pGVar13 >> 2) * -0x55555555;
                  if (iVar9 <= iVar20) goto LAB_007a6d6b;
                  if (piVar10[iVar20] == iVar5) {
                    piVar10[lVar18] = iVar5;
                    if (p->nObjs <= iVar8) goto LAB_007a6d2d;
                    uVar7 = Gia_ObjLevelId(p,iVar8);
                    pGVar13 = p->pObjs;
                    if ((pGVar3 < pGVar13) || (pGVar13 + p->nObjs <= pGVar3)) goto LAB_007a6d2d;
                    if (vLevels->nSize <= (int)uVar7) {
                      iVar9 = uVar7 + 1;
                      iVar8 = vLevels->nSize * 2;
                      if (iVar8 <= iVar9) {
                        iVar8 = iVar9;
                      }
                      if (vLevels->nCap < iVar8) {
                        sVar17 = (long)iVar8 << 4;
                        if (vLevels->pArray == (Vec_Int_t *)0x0) {
                          pVVar14 = (Vec_Int_t *)malloc(sVar17);
                        }
                        else {
                          pVVar14 = (Vec_Int_t *)realloc(vLevels->pArray,sVar17);
                        }
                        vLevels->pArray = pVVar14;
                        memset(pVVar14 + vLevels->nCap,0,((long)iVar8 - (long)vLevels->nCap) * 0x10)
                        ;
                        vLevels->nCap = iVar8;
                      }
                      vLevels->nSize = iVar9;
                    }
                    if (((int)uVar7 < 0) || (vLevels->nSize <= (int)uVar7)) goto LAB_007a6d8a;
                    Vec_IntPush(vLevels->pArray + uVar7,
                                (int)((ulong)((long)pGVar3 - (long)pGVar13) >> 2) * -0x55555555);
                    pGVar13 = p->pObjs;
                    if ((pGVar3 < pGVar13) || (pGVar13 + p->nObjs <= pGVar3)) goto LAB_007a6d2d;
                    Vec_IntPush(vWin,(int)((ulong)((long)pGVar3 - (long)pGVar13) >> 2) * -0x55555555
                               );
                    pGVar13 = p->pObjs;
                    if ((pGVar3 < pGVar13) || (pGVar13 + p->nObjs <= pGVar3)) goto LAB_007a6d2d;
                    iVar9 = Gia_ObjLevelId(p,(int)((ulong)((long)pGVar3 - (long)pGVar13) >> 2) *
                                             -0x55555555);
                    Vec_IntPushUniqueOrder(p_00,iVar9);
                  }
                }
              }
            }
            pGVar13 = p->pObjs;
            if (pGVar1 < pGVar13) goto LAB_007a6d2d;
          } while( true );
        }
      }
LAB_007a6ca8:
      pVVar11[lVar12].nSize = 0;
      lVar15 = lVar15 + 1;
    } while (lVar15 < p_00->nSize);
  }
  qsort(vWin->pArray,(long)vWin->nSize,4,Vec_IntSortCompare1);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  return;
LAB_007a6c8e:
  lVar19 = lVar19 + 1;
  if (pVVar11[lVar12].nSize <= lVar19) goto LAB_007a6ca8;
  goto LAB_007a6928;
}

Assistant:

void Gia_WinCreateFromCut( Gia_Man_t * p, Vec_Int_t * vIn, Vec_Wec_t * vLevels, Vec_Int_t * vWin )
{
    Vec_Int_t * vLevel; 
    Gia_Obj_t * pObj, * pFanout;
    int k, i, f, iObj, Level;
    Vec_Int_t * vUsed = Vec_IntAlloc( 100 );
    // precondition:  the levelized structure is empty
    assert( Vec_WecSizeSize(vLevels) == 0 );
    // clean the resulting array
    Vec_IntClear( vWin );
    // start a new trav ID and add nodes to the levelized structure
    Gia_ManIncrementTravId( p );
    Vec_IntForEachEntry( vIn, iObj, i )
    {
        Gia_ObjSetTravIdCurrentId( p, iObj );
        Vec_WecPush( vLevels, Gia_ObjLevelId(p, iObj), iObj );
        Vec_IntPush( vWin, iObj );
        Vec_IntPushUniqueOrder( vUsed, Gia_ObjLevelId(p, iObj) );
    }
    // iterate through all objects and explore their fanouts
    //Vec_WecForEachLevel( vLevels, vLevel, k )
    Vec_IntForEachEntry( vUsed, Level, k )
    {
        vLevel = Vec_WecEntry( vLevels, Level );
        Gia_ManForEachObjVec( vLevel, p, pObj, i )
            Gia_ObjForEachFanoutStatic( p, pObj, pFanout, f )
            {
                if ( f == 5 ) // explore first 5 fanouts of the node
                    break;
                if ( Gia_ObjIsAnd(pFanout) && // internal node
                    !Gia_ObjIsTravIdCurrent(p, pFanout) && // not in the window
                     Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin0(pFanout)) && // but fanins are
                     Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin1(pFanout)) )  // in the window
                {
                    // add fanout to the window and to the levelized structure
                    Gia_ObjSetTravIdCurrent( p, pFanout );
                    Vec_WecPush( vLevels, Gia_ObjLevel(p, pFanout), Gia_ObjId(p, pFanout) );
                    Vec_IntPush( vWin, Gia_ObjId(p, pFanout) );
                    Vec_IntPushUniqueOrder( vUsed, Gia_ObjLevel(p, pFanout) );
                }
            }
        Vec_IntClear( vLevel );
    }
    Vec_IntSort( vWin, 0 );
    Vec_IntFree( vUsed );
}